

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::ConstPlusRegPattern::TryToGenerateCode
          (ConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TOperationType TVar1;
  CBinopExpression *this_00;
  CExpression *pCVar2;
  CConstExpression *this_01;
  CTempExpression *this_02;
  CTemp rightRegister;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  CTemp local_78;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_58;
  
  if (tree != (INode *)0x0) {
    this_00 = (CBinopExpression *)
              __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
    if (this_00 == (CBinopExpression *)0x0) {
      return false;
    }
    TVar1 = CBinopExpression::getOperation(this_00);
    if ((TVar1 == PLUS) &&
       (pCVar2 = CBinopExpression::getLeftOperand(this_00), pCVar2 != (CExpression *)0x0)) {
      this_01 = (CConstExpression *)
                __dynamic_cast(pCVar2,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
      if (this_01 != (CConstExpression *)0x0) {
        pCVar2 = CBinopExpression::getRightOperand(this_00);
        if ((pCVar2 == (CExpression *)0x0) ||
           (this_02 = (CTempExpression *)
                      __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
           this_02 == (CTempExpression *)0x0)) {
          CTemp::CTemp(&local_78);
          pCVar2 = CBinopExpression::getLeftOperand(this_00);
          std::__cxx11::string::string((string *)&local_58,(string *)&local_78);
          local_58.second = pCVar2;
          std::pair<IRT::CTemp,_const_IRT::INode_*>::
          pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_a0,&local_58);
          std::
          vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
          ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                    ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                      *)children,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_58);
          std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp&>
                    (&local_a0.first,dest);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_a0.first.name._M_string_length);
          std::__cxx11::string::~string((string *)&local_78);
        }
        else {
          CTempExpression::getTemprorary(this_02);
          std::make_shared<AssemblyCode::MoveRegRegCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                    (&local_a0.first,dest);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_a0.first.name._M_string_length);
        }
        local_58.first.name._M_dataplus._M_p._0_4_ = CConstExpression::getValue(this_01);
        std::make_shared<AssemblyCode::AddRegConstCommand,IRT::CTemp_const&,int>
                  (&local_a0.first,(int *)dest);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::AddRegConstCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::AddRegConstCommand> *)&local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_a0.first.name._M_string_length);
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool
IRT::ConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                             AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::PLUS ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(binopPtr->getLeftOperand( ));
        if ( constPtr ) {
            ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
            if ( rightRegisterPtr ) {
                commands.emplace_back(
                        std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
            } else {
                CTemp rightRegister;
                children.push_back( std::make_pair( rightRegister, binopPtr->getLeftOperand( )));
                commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, rightRegister ));
            }
            commands.emplace_back( std::make_shared<AssemblyCode::AddRegConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}